

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O2

void device_reset_ymz280b(void *info)

{
  long lVar1;
  int iVar2;
  
  for (iVar2 = 0xff; -1 < iVar2; iVar2 = iVar2 + -1) {
    if (0x75 < iVar2 - 0x88U && iVar2 != 0x83) {
      *(char *)((long)info + 0x280) = (char)iVar2;
      write_to_register((ymz280b_state *)info,'\0');
    }
  }
  *(undefined2 *)((long)info + 0x280) = 0;
  *(undefined4 *)((long)info + 0x290) = 0;
  for (lVar1 = 0x66; lVar1 != 0x2c6; lVar1 = lVar1 + 0x4c) {
    *(undefined8 *)((long)info + lVar1 + -6) = 0x4000;
    *(undefined1 *)((long)info + lVar1 + -0x46) = 0;
  }
  return;
}

Assistant:

static void device_reset_ymz280b(void *info)
{
	ymz280b_state *chip = (ymz280b_state *)info;
	int i;

	/* initial clear registers */
	for (i = 0xff; i >= 0; i--)
	{
		if (i == 0x83 || (i >= 0x88 && i <= 0xFD))
			continue;	// avoid too many debug messages
		chip->current_register = i;
		write_to_register(chip, 0);
	}

	chip->current_register = 0;
	chip->status_register = 0;
	chip->ext_mem_address = 0;

	/* clear other voice parameters */
	for (i = 0; i < 8; i++)
	{
		struct YMZ280BVoice *voice = &chip->voice[i];

		voice->curr_sample = 0;
		voice->last_sample = 0;
		voice->output_pos = FRAC_ONE;
		voice->playing = 0;
	}
	
	return;
}